

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O1

QSize operator/(QSize *s,qreal c)

{
  ulong uVar1;
  undefined4 in_EDX;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6._0_8_ = (double)(*s).wd.m_i;
  auVar6._8_8_ = (double)(*s).ht.m_i;
  auVar7._8_8_ = c;
  auVar7._0_8_ = c;
  auVar7 = divpd(auVar6,auVar7);
  auVar4._0_8_ = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar7._0_8_;
  auVar4._8_8_ = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar7._8_8_;
  auVar7 = minpd(_DAT_0066f5d0,auVar4);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
  uVar2 = movmskpd(in_EDX,auVar5);
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar7._8_8_ << 0x20;
  }
  uVar1 = 0x80000000;
  if ((uVar2 & 1) != 0) {
    uVar1 = (ulong)(uint)(int)auVar7._0_8_;
  }
  return (QSize)(uVar1 | uVar3);
}

Assistant:

friend inline QSize operator/(const QSize &s, qreal c)
    {
        Q_ASSERT(!qFuzzyIsNull(c));
        return QSize(QtPrivate::qSaturateRound(s.width() / c), QtPrivate::qSaturateRound(s.height() / c));
    }